

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O3

ans_fold_encode<6U> *
ans_fold_encode<6U>::create(ans_fold_encode<6U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  uint *puVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  pointer puVar10;
  pointer __s;
  size_t sVar11;
  uint64_t uVar12;
  uint largest_sym;
  long lVar13;
  ulong uVar14;
  uint64_t *puVar15;
  uint uVar16;
  long lVar18;
  uint32_t uVar19;
  int iVar20;
  int iVar21;
  ushort uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  undefined1 local_48 [16];
  pointer local_38;
  uint uVar17;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __s = (pointer)operator_new(0x40000);
  largest_sym = 0;
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x8000;
  memset(__s,0,0x40000);
  if (n != 0) {
    sVar11 = 0;
    largest_sym = 0;
    do {
      uVar17 = in_u32[sVar11];
      iVar20 = 0;
      uVar16 = uVar17;
      iVar21 = 0;
      if (0x1fff < uVar17) {
        do {
          uVar16 = uVar17 >> 8;
          iVar20 = iVar20 + 0x1fe0;
          bVar4 = 0x1fffff < uVar17;
          uVar17 = uVar16;
          iVar21 = iVar20;
        } while (bVar4);
      }
      uVar16 = iVar21 + uVar16;
      __s[uVar16] = __s[uVar16] + 1;
      if (uVar16 <= largest_sym) {
        uVar16 = largest_sym;
      }
      largest_sym = uVar16;
      sVar11 = sVar11 + 1;
    } while (sVar11 != n);
  }
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x8000;
  adjust_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,&local_60,largest_sym
               ,true,1);
  puVar10 = local_38;
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_38 = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar10;
  local_48 = (undefined1  [16])0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
    }
  }
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    uVar12 = 0;
  }
  else {
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    uVar14 = 0;
    auVar26 = vpbroadcastq_avx512f();
    auVar26 = vpsrlq_avx512f(auVar26,2);
    do {
      auVar27 = vpbroadcastq_avx512f();
      auVar28 = vmovdqa64_avx512f(auVar29);
      auVar29 = vporq_avx512f(auVar27,auVar24);
      auVar27 = vporq_avx512f(auVar27,auVar25);
      uVar7 = vpcmpuq_avx512f(auVar27,auVar26,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar29,auVar26,2);
      bVar9 = (byte)uVar7;
      uVar22 = CONCAT11(bVar9,bVar8);
      auVar29 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar14));
      auVar27._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar29._4_4_;
      auVar27._0_4_ = (uint)(bVar8 & 1) * auVar29._0_4_;
      auVar27._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar29._8_4_;
      auVar27._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar29._12_4_;
      auVar27._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar29._16_4_;
      auVar27._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar29._20_4_;
      auVar27._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar29._24_4_;
      auVar27._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar29._28_4_;
      auVar27._32_4_ = (uint)(bVar9 & 1) * auVar29._32_4_;
      auVar27._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar29._36_4_;
      auVar27._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar29._40_4_;
      auVar27._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar29._44_4_;
      auVar27._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar29._48_4_;
      auVar27._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar29._52_4_;
      auVar27._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar29._56_4_;
      auVar27._60_4_ = (uint)(bVar9 >> 7) * auVar29._60_4_;
      uVar14 = uVar14 + 0x10;
      auVar29 = vpaddd_avx512f(auVar27,auVar28);
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar14);
    auVar24 = vmovdqa32_avx512f(auVar29);
    auVar25._0_4_ = (uint)(bVar8 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar28._0_4_;
    bVar4 = (bool)((byte)(uVar22 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar4 * auVar24._4_4_ | (uint)!bVar4 * auVar28._4_4_;
    bVar4 = (bool)((byte)(uVar22 >> 2) & 1);
    auVar25._8_4_ = (uint)bVar4 * auVar24._8_4_ | (uint)!bVar4 * auVar28._8_4_;
    bVar4 = (bool)((byte)(uVar22 >> 3) & 1);
    auVar25._12_4_ = (uint)bVar4 * auVar24._12_4_ | (uint)!bVar4 * auVar28._12_4_;
    bVar4 = (bool)((byte)(uVar22 >> 4) & 1);
    auVar25._16_4_ = (uint)bVar4 * auVar24._16_4_ | (uint)!bVar4 * auVar28._16_4_;
    bVar4 = (bool)((byte)(uVar22 >> 5) & 1);
    auVar25._20_4_ = (uint)bVar4 * auVar24._20_4_ | (uint)!bVar4 * auVar28._20_4_;
    bVar4 = (bool)((byte)(uVar22 >> 6) & 1);
    auVar25._24_4_ = (uint)bVar4 * auVar24._24_4_ | (uint)!bVar4 * auVar28._24_4_;
    bVar4 = (bool)((byte)(uVar22 >> 7) & 1);
    auVar25._28_4_ = (uint)bVar4 * auVar24._28_4_ | (uint)!bVar4 * auVar28._28_4_;
    auVar25._32_4_ = (uint)(bVar9 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar28._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar25._36_4_ = (uint)bVar4 * auVar24._36_4_ | (uint)!bVar4 * auVar28._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar25._40_4_ = (uint)bVar4 * auVar24._40_4_ | (uint)!bVar4 * auVar28._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar25._44_4_ = (uint)bVar4 * auVar24._44_4_ | (uint)!bVar4 * auVar28._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar25._48_4_ = (uint)bVar4 * auVar24._48_4_ | (uint)!bVar4 * auVar28._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar25._52_4_ = (uint)bVar4 * auVar24._52_4_ | (uint)!bVar4 * auVar28._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar25._56_4_ = (uint)bVar4 * auVar24._56_4_ | (uint)!bVar4 * auVar28._56_4_;
    auVar25._60_4_ =
         (uint)(bVar9 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar28._60_4_;
    auVar23 = vextracti64x4_avx512f(auVar25,1);
    auVar24 = vpaddd_avx512f(auVar25,ZEXT3264(auVar23));
    auVar5 = vpaddd_avx(auVar24._0_16_,auVar24._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    uVar12 = (uint64_t)auVar5._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar12;
  std::vector<enc_entry_fold,_std::allocator<enc_entry_fold>_>::resize
            (&__return_storage_ptr__->table,(ulong)(largest_sym + 1));
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 2;
    lVar18 = 0;
    uVar19 = 0;
    puVar15 = &((__return_storage_ptr__->table).
                super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
                super__Vector_impl_data._M_start)->sym_upper_bound;
    do {
      ((enc_entry_fold *)(puVar15 + -1))->freq = (uint16_t)puVar2[lVar18];
      *(uint32_t *)((long)puVar15 + -4) = uVar19;
      puVar1 = puVar2 + lVar18;
      lVar18 = lVar18 + 1;
      uVar19 = uVar19 + *puVar1;
      *puVar15 = (ulong)*puVar1 << 0x24;
      puVar15 = puVar15 + 2;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar18);
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static ans_fold_encode create(const uint32_t* in_u32, size_t n)
    {
        const uint32_t MAX_SIGMA = 1 << (fidelity + 8 + 1);
        ans_fold_encode model;
        std::vector<uint64_t> freqs(MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_fold_mapping<fidelity>(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }